

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall
ParserProbModelXML::AddToLocalSFActionScope(ParserProbModelXML *this,Index sfI,Scope *AScope)

{
  size_type sVar1;
  uint in_ESI;
  Scope *in_RDI;
  value_type *in_stack_ffffffffffffff98;
  Scope *this_00;
  Scope *in_stack_ffffffffffffffc0;
  
  while( true ) {
    sVar1 = std::vector<Scope,_std::allocator<Scope>_>::size
                      ((vector<Scope,_std::allocator<Scope>_> *)(in_RDI + 6));
    if (in_ESI < sVar1) break;
    this_00 = in_RDI + 6;
    Scope::Scope(this_00);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)this_00,in_stack_ffffffffffffff98);
    Scope::~Scope((Scope *)0xa8a625);
  }
  std::vector<Scope,_std::allocator<Scope>_>::operator[]
            ((vector<Scope,_std::allocator<Scope>_> *)(in_RDI + 6),(ulong)in_ESI);
  Scope::Insert(in_stack_ffffffffffffffc0,in_RDI);
  return;
}

Assistant:

void ParserProbModelXML::AddToLocalSFActionScope(Index sfI, Scope AScope)
{
    while(_m_AScopes_Y.size() <= sfI)
        _m_AScopes_Y.push_back(Scope());
    
    _m_AScopes_Y[sfI].Insert(AScope);
}